

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Constructor::do_call
          (Dynamic_Object_Constructor *this,Function_Params *params,
          Type_Conversions_State *t_conversions)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  initializer_list<chaiscript::Boxed_Value> __l;
  Boxed_Value BVar2;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> new_params;
  allocator_type local_d1;
  Type_Conversions_State local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  Type_Conversions *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  Dynamic_Object local_98;
  pointer local_38;
  
  local_c0 = &local_b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,params[2].m_end,
             (long)&((params[2].m_end)->m_data).
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr +
             (long)&((params[3].m_begin)->m_data).
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>);
  paVar1 = &local_98.m_type_name.field_2;
  if (local_c0 == &local_b0) {
    local_98.m_type_name.field_2._8_8_ = local_b0._8_8_;
    local_98.m_type_name._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.m_type_name._M_dataplus._M_p = (pointer)local_c0;
  }
  local_98.m_type_name.field_2._M_allocated_capacity._1_7_ = local_b0._M_allocated_capacity._1_7_;
  local_98.m_type_name.field_2._M_local_buf[0] = local_b0._M_local_buf[0];
  local_98.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header;
  local_98.m_type_name._M_string_length = (size_type)local_b8;
  local_b8 = (Type_Conversions *)0x0;
  local_b0._M_local_buf[0] = '\0';
  local_98.m_option_explicit = false;
  local_98.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98.m_attrs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0 = &local_b0;
  local_98.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Boxed_Value::Boxed_Value<chaiscript::dispatch::Dynamic_Object,void>
            ((Boxed_Value *)this,&local_98,true);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  ::~_Rb_tree(&local_98.m_attrs._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_type_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.m_type_name._M_dataplus._M_p,
                    local_98.m_type_name.field_2._M_allocated_capacity + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,CONCAT71(local_b0._M_allocated_capacity._1_7_,local_b0._M_local_buf[0])
                             + 1);
  }
  local_d0.m_conversions._M_data =
       (Type_Conversions *)(this->super_Proxy_Function_Base)._vptr_Proxy_Function_Base;
  local_d0.m_saves._M_data =
       (Conversion_Saves *)
       (this->super_Proxy_Function_Base).m_types.
       super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
       super__Vector_impl_data._M_start;
  if (local_d0.m_saves._M_data != (Conversion_Saves *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((local_d0.m_saves._M_data)->saves).
               super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
               ._M_impl.super__Vector_impl_data._M_start =
           *(int *)&((local_d0.m_saves._M_data)->saves).
                    super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      *(int *)&((local_d0.m_saves._M_data)->saves).
               super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
               ._M_impl.super__Vector_impl_data._M_start =
           *(int *)&((local_d0.m_saves._M_data)->saves).
                    super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  __l._M_len = 1;
  __l._M_array = (iterator)&local_d0;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
            ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)&local_98,
             __l,&local_d1);
  if (local_d0.m_saves._M_data != (Conversion_Saves *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0.m_saves._M_data);
  }
  std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::
  _M_range_insert<chaiscript::Boxed_Value_const*>
            ((vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>> *)&local_98,
             local_98.m_type_name._M_string_length,(t_conversions->m_conversions)._M_data,
             (t_conversions->m_saves)._M_data);
  local_d0.m_conversions._M_data = (Type_Conversions *)local_98.m_type_name._M_dataplus._M_p;
  if (local_98.m_type_name._M_dataplus._M_p == (pointer)local_98.m_type_name._M_string_length) {
    local_d0.m_conversions._M_data = (Type_Conversions *)0x0;
  }
  local_d0.m_saves._M_data = (Conversion_Saves *)local_98.m_type_name._M_string_length;
  if (local_98.m_type_name._M_dataplus._M_p == (pointer)local_98.m_type_name._M_string_length) {
    local_d0.m_saves._M_data = (Conversion_Saves *)(Type_Conversions *)0x0;
  }
  Proxy_Function_Base::operator()
            ((Proxy_Function_Base *)&stack0xffffffffffffffc0,(Function_Params *)params[4].m_end,
             &local_d0);
  if (local_38 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
  }
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
            ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)&local_98)
  ;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value do_call(const chaiscript::Function_Params &params, const Type_Conversions_State &t_conversions) const override {
          auto bv = Boxed_Value(Dynamic_Object(m_type_name), true);
          std::vector<Boxed_Value> new_params{bv};
          new_params.insert(new_params.end(), params.begin(), params.end());

          (*m_func)(chaiscript::Function_Params{new_params}, t_conversions);

          return bv;
        }